

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O0

void __thiscall FileManager::closeFile(FileManager *this)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<AssemblerFile> local_20;
  FileManager *local_10;
  FileManager *this_local;
  
  local_10 = this;
  bVar1 = std::operator==(&this->activeFile,(nullptr_t)0x0);
  if (bVar1) {
    Logger::queueError<>(Warning,"No file opened");
  }
  else {
    peVar2 = std::__shared_ptr_access<AssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<AssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->activeFile);
    (*peVar2->_vptr_AssemblerFile[3])();
    std::shared_ptr<AssemblerFile>::shared_ptr(&local_20,(nullptr_t)0x0);
    std::shared_ptr<AssemblerFile>::operator=(&this->activeFile,&local_20);
    std::shared_ptr<AssemblerFile>::~shared_ptr(&local_20);
  }
  return;
}

Assistant:

void FileManager::closeFile()
{
	if (activeFile == nullptr)
	{
		Logger::queueError(Logger::Warning, "No file opened");
		return;
	}

	activeFile->close();
	activeFile = nullptr;
}